

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O1

void __thiscall
cmNinjaTargetGenerator::EmitSwiftDependencyInfo(cmNinjaTargetGenerator *this,cmSourceFile *source)

{
  char *pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  cmLocalNinjaGenerator *pcVar4;
  cmMakefile *this_00;
  ValueHolder VVar5;
  bool bVar6;
  string *path;
  char *pcVar7;
  size_t sVar8;
  long *plVar9;
  Value *pVVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  size_type *psVar12;
  Value entry;
  size_type __dnew;
  string objectFileDir;
  size_type __dnew_2;
  string swiftDiaPath;
  string swiftDepsPath;
  string objectFilePath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string makeDepsPath;
  string sourceFilePath;
  ValueHolder local_240;
  char *local_238;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_230;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  long *local_158 [2];
  long local_148 [2];
  string local_138;
  string local_118;
  Value local_f8;
  Value local_d0;
  Value local_a8;
  Value local_80;
  Value local_58;
  
  path = cmSourceFile::GetFullPath_abi_cxx11_(source);
  ConvertToNinjaPath((string *)&local_240,this,path);
  ConvertToNinjaPath(&local_118,this,(string *)&local_240);
  if (local_240 != &local_230) {
    operator_delete(local_240.string_,local_230._M_allocated_capacity + 1);
  }
  GetObjectFilePath_abi_cxx11_((string *)&local_240,this,source);
  ConvertToNinjaPath(&local_178,this,(string *)&local_240);
  if (local_240 != &local_230) {
    operator_delete(local_240.string_,local_230._M_allocated_capacity + 1);
  }
  pcVar1 = local_230._M_local_buf + 8;
  local_240 = (ValueHolder)source;
  local_238 = pcVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_238,local_178._M_dataplus._M_p,
             local_178._M_dataplus._M_p + local_178._M_string_length);
  VVar5 = local_240;
  paVar2 = &local_1f8.field_2;
  local_218._M_dataplus._M_p = (pointer)0x17;
  local_1f8._M_dataplus._M_p = (pointer)paVar2;
  local_1f8._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_1f8,(ulong)&local_218);
  local_1f8.field_2._M_allocated_capacity = (size_type)local_218._M_dataplus._M_p;
  *(undefined8 *)local_1f8._M_dataplus._M_p = 0x45445f7466697753;
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p + 8) = 'P';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p + 9) = 'E';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p + 10) = 'N';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p + 0xb) = 'D';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p + 0xc) = 'E';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p + 0xd) = 'N';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p + 0xe) = 'C';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p + 0xf) = 'I';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p + 0xf) = 'I';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p + 0x10) = 'E';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p + 0x11) = 'S';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p + 0x12) = '_';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p + 0x13) = 'F';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p + 0x14) = 'I';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p + 0x15) = 'L';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p + 0x16) = 'E';
  local_1f8._M_string_length = (size_type)local_218._M_dataplus._M_p;
  local_1f8._M_dataplus._M_p[(long)local_218._M_dataplus._M_p] = '\0';
  pcVar7 = cmSourceFile::GetProperty(VVar5.string_,&local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1f8._M_dataplus._M_p,(ulong)(local_1f8.field_2._M_allocated_capacity + 1))
    ;
  }
  if (pcVar7 == (char *)0x0) {
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_198,local_238,local_238 + local_230._M_allocated_capacity);
    std::__cxx11::string::append((char *)&local_198);
  }
  else {
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    sVar8 = strlen(pcVar7);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,pcVar7,pcVar7 + sVar8);
  }
  if (local_238 != pcVar1) {
    operator_delete(local_238,local_230._8_8_ + 1);
  }
  local_240 = (ValueHolder)source;
  local_238 = pcVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_238,local_178._M_dataplus._M_p,
             local_178._M_dataplus._M_p + local_178._M_string_length);
  VVar5 = local_240;
  local_218._M_dataplus._M_p = (pointer)0x16;
  local_1f8._M_dataplus._M_p = (pointer)paVar2;
  local_1f8._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_1f8,(ulong)&local_218);
  local_1f8.field_2._M_allocated_capacity = (size_type)local_218._M_dataplus._M_p;
  *(undefined8 *)local_1f8._M_dataplus._M_p = 0x49445f7466697753;
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p + 8) = 'A';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p + 9) = 'G';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p + 10) = 'N';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p + 0xb) = 'O';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p + 0xc) = 'S';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p + 0xd) = 'T';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p + 0xe) = 'I';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p + 0xf) = 'C';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p + 0xe) = 'I';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p + 0xf) = 'C';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p + 0x10) = 'S';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p + 0x11) = '_';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p + 0x12) = 'F';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p + 0x13) = 'I';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p + 0x14) = 'L';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p + 0x15) = 'E';
  local_1f8._M_string_length = (size_type)local_218._M_dataplus._M_p;
  local_1f8._M_dataplus._M_p[(long)local_218._M_dataplus._M_p] = '\0';
  pcVar7 = cmSourceFile::GetProperty(VVar5.string_,&local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1f8._M_dataplus._M_p,(ulong)(local_1f8.field_2._M_allocated_capacity + 1))
    ;
  }
  local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
  if (pcVar7 == (char *)0x0) {
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1b8,local_238,local_238 + local_230._M_allocated_capacity);
    std::__cxx11::string::append((char *)&local_1b8);
  }
  else {
    sVar8 = strlen(pcVar7);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,pcVar7,pcVar7 + sVar8);
  }
  if (local_238 != pcVar1) {
    operator_delete(local_238,local_230._8_8_ + 1);
  }
  pcVar4 = this->LocalGenerator;
  GetObjectFilePath_abi_cxx11_(&local_1f8,this,source);
  ConvertToNinjaPath((string *)&local_240,this,&local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1f8._M_dataplus._M_p,(ulong)(local_1f8.field_2._M_allocated_capacity + 1))
    ;
  }
  cmsys::SystemTools::GetFilenamePath(&local_1f8,(string *)&local_240);
  this_00 = (this->super_cmCommonTargetGenerator).Makefile;
  paVar3 = &local_218.field_2;
  local_1d8._M_dataplus._M_p = (pointer)0x23;
  local_218._M_dataplus._M_p = (pointer)paVar3;
  local_218._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_218,(ulong)&local_1d8);
  local_218.field_2._M_allocated_capacity = (size_type)local_1d8._M_dataplus._M_p;
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p + 0x10) = 'L';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p + 0x11) = 'E';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p + 0x12) = '_';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p + 0x13) = 'E';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p + 0x14) = 'X';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p + 0x15) = 'T';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p + 0x16) = 'N';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p + 0x17) = 'S';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p + 0x18) = 'I';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p + 0x19) = 'O';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p + 0x1a) = 'N';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p + 0x1b) = '_';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p + 0x1c) = 'R';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p + 0x1d) = 'E';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p + 0x1e) = 'P';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p + 0x1f) = 'L';
  *(undefined8 *)local_218._M_dataplus._M_p = 0x77535f454b414d43;
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p + 8) = 'i';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p + 9) = 'f';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p + 10) = 't';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p + 0xb) = '_';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p + 0xc) = 'D';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p + 0xd) = 'E';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p + 0xe) = 'P';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p + 0xf) = 'F';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p + 0x1f) = 'L';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p + 0x20) = 'A';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p + 0x21) = 'C';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p + 0x22) = 'E';
  local_218._M_string_length = (size_type)local_1d8._M_dataplus._M_p;
  local_218._M_dataplus._M_p[(long)local_1d8._M_dataplus._M_p] = '\0';
  bVar6 = cmMakefile::IsOn(this_00,&local_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar3) {
    operator_delete(local_218._M_dataplus._M_p,(ulong)(local_218.field_2._M_allocated_capacity + 1))
    ;
  }
  if (bVar6) {
    cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_1d8,(string *)&local_240);
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_1d8);
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 == paVar11) {
      local_218.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
      local_218.field_2._8_8_ = plVar9[3];
      local_218._M_dataplus._M_p = (pointer)paVar3;
    }
    else {
      local_218.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
      local_218._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_218._M_string_length = plVar9[1];
    *plVar9 = (long)paVar11;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    paVar11 = &local_1d8.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != paVar11) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    local_158[0] = local_148;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_158,local_1f8._M_dataplus._M_p,
               local_1f8._M_dataplus._M_p + local_1f8._M_string_length);
    std::__cxx11::string::append((char *)local_158);
    plVar9 = (long *)std::__cxx11::string::_M_append
                               ((char *)local_158,(ulong)local_218._M_dataplus._M_p);
    psVar12 = (size_type *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_1d8.field_2._M_allocated_capacity = *psVar12;
      local_1d8.field_2._8_8_ = plVar9[3];
      local_1d8._M_dataplus._M_p = (pointer)paVar11;
    }
    else {
      local_1d8.field_2._M_allocated_capacity = *psVar12;
      local_1d8._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_1d8._M_string_length = plVar9[1];
    *plVar9 = (long)psVar12;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    cmOutputConverter::ConvertToOutputFormat
              (&local_138,
               &(pcVar4->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,&local_1d8,SHELL);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != paVar11) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    if (local_158[0] != local_148) {
      operator_delete(local_158[0],local_148[0] + 1);
    }
  }
  else {
    local_218._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_218,local_240.int_,local_238 + local_240.string_);
    std::__cxx11::string::append((char *)&local_218);
    cmOutputConverter::ConvertToOutputFormat
              (&local_138,
               &(pcVar4->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,&local_218,SHELL);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar3) {
    operator_delete(local_218._M_dataplus._M_p,(ulong)(local_218.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1f8._M_dataplus._M_p,(ulong)(local_1f8.field_2._M_allocated_capacity + 1))
    ;
  }
  if (local_240 != &local_230) {
    operator_delete(local_240.string_,local_230._M_allocated_capacity + 1);
  }
  Json::Value::Value((Value *)&local_240,objectValue);
  Json::Value::Value(&local_58,&local_178);
  pVVar10 = Json::Value::operator[]((Value *)&local_240,"object");
  Json::Value::operator=(pVVar10,&local_58);
  Json::Value::~Value(&local_58);
  Json::Value::Value(&local_80,&local_138);
  pVVar10 = Json::Value::operator[]((Value *)&local_240,"dependencies");
  Json::Value::operator=(pVVar10,&local_80);
  Json::Value::~Value(&local_80);
  Json::Value::Value(&local_a8,&local_198);
  pVVar10 = Json::Value::operator[]((Value *)&local_240,"swift-dependencies");
  Json::Value::operator=(pVVar10,&local_a8);
  Json::Value::~Value(&local_a8);
  Json::Value::Value(&local_d0,&local_1b8);
  pVVar10 = Json::Value::operator[]((Value *)&local_240,"diagnostics");
  Json::Value::operator=(pVVar10,&local_d0);
  Json::Value::~Value(&local_d0);
  Json::Value::Value(&local_f8,(Value *)&local_240);
  pVVar10 = Json::Value::operator[](&this->SwiftOutputMap,&local_118);
  Json::Value::operator=(pVVar10,&local_f8);
  Json::Value::~Value(&local_f8);
  Json::Value::~Value((Value *)&local_240);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmNinjaTargetGenerator::EmitSwiftDependencyInfo(
  cmSourceFile const* source)
{
  std::string const sourceFilePath =
    this->ConvertToNinjaPath(this->GetSourceFilePath(source));
  std::string const objectFilePath =
    this->ConvertToNinjaPath(this->GetObjectFilePath(source));
  std::string const swiftDepsPath = [source, objectFilePath]() -> std::string {
    if (const char* name = source->GetProperty("Swift_DEPENDENCIES_FILE")) {
      return name;
    }
    return objectFilePath + ".swiftdeps";
  }();
  std::string const swiftDiaPath = [source, objectFilePath]() -> std::string {
    if (const char* name = source->GetProperty("Swift_DIAGNOSTICS_FILE")) {
      return name;
    }
    return objectFilePath + ".dia";
  }();
  std::string const makeDepsPath = [this, source]() -> std::string {
    cmLocalNinjaGenerator const* local = this->GetLocalGenerator();
    std::string const objectFileName =
      this->ConvertToNinjaPath(this->GetObjectFilePath(source));
    std::string const objectFileDir =
      cmSystemTools::GetFilenamePath(objectFileName);

    if (this->Makefile->IsOn("CMAKE_Swift_DEPFLE_EXTNSION_REPLACE")) {
      std::string dependFileName =
        cmSystemTools::GetFilenameWithoutLastExtension(objectFileName) + ".d";
      return local->ConvertToOutputFormat(objectFileDir + "/" + dependFileName,
                                          cmOutputConverter::SHELL);
    }
    return local->ConvertToOutputFormat(objectFileName + ".d",
                                        cmOutputConverter::SHELL);
  }();

  // build the source file mapping
  // https://github.com/apple/swift/blob/master/docs/Driver.md#output-file-maps
  Json::Value entry = Json::Value(Json::objectValue);
  entry["object"] = objectFilePath;
  entry["dependencies"] = makeDepsPath;
  entry["swift-dependencies"] = swiftDepsPath;
  entry["diagnostics"] = swiftDiaPath;
  SwiftOutputMap[sourceFilePath] = entry;
}